

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

QHttpNetworkReply * __thiscall
QHttpNetworkConnectionPrivate::queueRequest
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkRequest *request)

{
  QObject *ptr;
  QHttpNetworkConnectionChannel *pQVar1;
  bool bVar2;
  Priority PVar3;
  QHttpNetworkReply *this_00;
  QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *this_01;
  long in_FS_OFFSET;
  Priority local_4c;
  HttpMessagePair local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = *(QObject **)&this->field_0x8;
  this_00 = (QHttpNetworkReply *)operator_new(0x18);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_48,request);
  QHttpNetworkReply::QHttpNetworkReply
            ((QHttpNetworkReply *)this_00,(QUrl *)&local_48,(QObject *)0x0);
  QUrl::~QUrl((QUrl *)&local_48);
  QHttpNetworkReply::setRequest((QHttpNetworkReply *)this_00,request);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)&this_00->field_0x8 + 0x168),ptr);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)&this_00->field_0x8 + 0x178),
             &this->channels->super_QObject);
  local_48.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QHttpNetworkRequest::QHttpNetworkRequest(&local_48.first,request);
  local_48.second = this_00;
  bVar2 = QHttpNetworkRequest::isPreConnect(request);
  if (bVar2) {
    this->preConnectRequests = this->preConnectRequests + 1;
  }
  if ((this->connectionType == ConnectionTypeHTTP) ||
     (((this->connectionType == ConnectionTypeHTTP2 && (this->encrypt == false)) &&
      (this->channels->switchedToHttp2 == false)))) {
    PVar3 = QHttpNetworkRequest::priority(request);
    if (PVar3 - NormalPriority < 2) {
      this_01 = (QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)&this->lowPriorityQueue;
    }
    else {
      if (PVar3 != HighPriority) goto LAB_001ebab2;
      this_01 = (QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)&this->highPriorityQueue
      ;
    }
    QList<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
    emplaceFront<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>(this_01,&local_48);
  }
  else {
    if (*(char *)(*(long *)&(local_48.second)->field_0x8 + 0x1b8) == '\0') {
      prepareRequest(this,&local_48);
    }
    pQVar1 = this->channels;
    local_4c = QHttpNetworkRequest::priority(request);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
              (&pQVar1->h2RequestsToSend,(int *)&local_4c,&local_48);
  }
LAB_001ebab2:
  if (this->networkLayerState - IPv4 < 2) {
    _q_startNextRequest(this);
  }
  else if (this->networkLayerState < IPv4) {
    startHostInfoLookup(this);
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkReply* QHttpNetworkConnectionPrivate::queueRequest(const QHttpNetworkRequest &request)
{
    Q_Q(QHttpNetworkConnection);

    // The reply component of the pair is created initially.
    QHttpNetworkReply *reply = new QHttpNetworkReply(request.url());
    reply->setRequest(request);
    reply->d_func()->connection = q;
    reply->d_func()->connectionChannel = &channels[0]; // will have the correct one set later
    HttpMessagePair pair = std::pair(request, reply);

    if (request.isPreConnect())
        preConnectRequests++;

    if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP
        || (!encrypt && connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2 && !channels[0].switchedToHttp2)) {
        switch (request.priority()) {
        case QHttpNetworkRequest::HighPriority:
            highPriorityQueue.prepend(pair);
            break;
        case QHttpNetworkRequest::NormalPriority:
        case QHttpNetworkRequest::LowPriority:
            lowPriorityQueue.prepend(pair);
            break;
        }
    }
    else { // HTTP/2 ('h2' mode)
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(request.priority(), pair);
    }

    // For Happy Eyeballs the networkLayerState is set to Unknown
    // until we have started the first connection attempt. So no
    // request will be started until we know if IPv4 or IPv6
    // should be used.
    if (networkLayerState == Unknown || networkLayerState == HostLookupPending) {
        startHostInfoLookup();
    } else if ( networkLayerState == IPv4 || networkLayerState == IPv6 ) {
        // this used to be called via invokeMethod and a QueuedConnection
        // It is the only place _q_startNextRequest is called directly without going
        // through the event loop using a QueuedConnection.
        // This is dangerous because of recursion that might occur when emitting
        // signals as DirectConnection from this code path. Therefore all signal
        // emissions that can come out from this code path need to
        // be QueuedConnection.
        // We are currently trying to fine-tune this.
        _q_startNextRequest();
    }
    return reply;
}